

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  size_type *psVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  _Node *p_Var7;
  _Node **pp_Var8;
  char cVar9;
  ulong *puVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  char *pcVar15;
  size_type sVar16;
  char *pcVar17;
  _Node **pp_Var18;
  _Node *p_Var19;
  _Node **pp_Var20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  cVar9 = *(char *)&(name->_M_dataplus)._M_p;
  if (cVar9 == '\0') {
    pcVar6 = (char *)0x0;
    pcVar15 = (char *)parent;
  }
  else {
    pcVar11 = (char *)((long)&(name->_M_dataplus)._M_p + 1);
    pcVar6 = (char *)0x0;
    do {
      pcVar15 = (char *)((long)pcVar6 * 5);
      pcVar6 = pcVar15 + cVar9;
      cVar9 = *pcVar11;
      pcVar11 = pcVar11 + 1;
    } while (cVar9 != '\0');
  }
  uVar14 = (this->symbols_by_parent_).
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_bucket_count;
  uVar12 = (ulong)(pcVar6 + (long)parent * 0xffff) % uVar14;
  p_Var7 = (this->symbols_by_parent_).
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_buckets[uVar12];
  do {
    if (p_Var7 == (_Node *)0x0) {
      uVar2 = (this->symbols_by_parent_).
              super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_element_count;
      if ((this->symbols_by_parent_).
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_rehash_policy._M_next_resize < uVar2 + 1) {
        fVar22 = (this->symbols_by_parent_).
                 super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                 .
                 super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                 .
                 super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 ._M_rehash_policy._M_max_load_factor;
        fVar23 = ((float)uVar2 + 1.0) / fVar22;
        fVar21 = (float)uVar14;
        bVar4 = fVar21 < fVar23;
        if (fVar23 <= fVar21) {
          this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     *)0x0;
        }
        else {
          fVar21 = fVar21 * (this->symbols_by_parent_).
                            super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                            .
                            super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                            .
                            super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                            ._M_rehash_policy._M_growth_factor;
          if (fVar21 <= fVar23) {
            fVar21 = fVar23;
          }
          fVar21 = ceilf(fVar21);
          pcVar11 = (char *)0x12f;
          puVar10 = &std::tr1::__detail::__prime_list;
          do {
            pcVar15 = (char *)((ulong)pcVar11 >> 1);
            pcVar17 = pcVar11 + ~(ulong)pcVar15;
            pcVar11 = pcVar15;
            if (puVar10[(long)pcVar15] <
                (ulong)((long)(fVar21 - 9.223372e+18) & (long)fVar21 >> 0x3f | (long)fVar21)) {
              puVar10 = puVar10 + (long)pcVar15 + 1;
              pcVar11 = pcVar17;
            }
          } while (0 < (long)pcVar11);
          this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     *)*puVar10;
          fVar21 = (float)this_00;
        }
        fVar22 = ceilf(fVar22 * fVar21);
        (this->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_rehash_policy._M_next_resize =
             (long)(fVar22 - 9.223372e+18) & (long)fVar22 >> 0x3f | (long)fVar22;
      }
      else {
        bVar4 = false;
        this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)0x0;
      }
      p_Var7 = (_Node *)operator_new(0x28);
      (p_Var7->_M_v).first.first = parent;
      (p_Var7->_M_v).first.second = (char *)name;
      (p_Var7->_M_v).second.type = symbol.type;
      (p_Var7->_M_v).second.field_1 = symbol.field_1;
      p_Var7->_M_next =
           (_Hash_node<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
            *)0x0;
      if (bVar4) {
        uVar12 = (ulong)(pcVar6 + (long)parent * 0xffff) % (ulong)this_00;
        pp_Var8 = std::tr1::
                  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ::_M_allocate_buckets(this_00,(size_type)pcVar15);
        pp_Var18 = (this->symbols_by_parent_).
                   super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                   .
                   super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                   .
                   super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ._M_buckets;
        sVar3 = (this->symbols_by_parent_).
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_bucket_count;
        if (sVar3 != 0) {
          sVar16 = 0;
          do {
            p_Var19 = pp_Var18[sVar16];
            if (p_Var19 != (_Node *)0x0) {
              pp_Var20 = pp_Var18 + sVar16;
              do {
                pcVar15 = (p_Var19->_M_v).first.second;
                cVar9 = *pcVar15;
                if (cVar9 == '\0') {
                  lVar13 = 0;
                }
                else {
                  lVar13 = 0;
                  do {
                    pcVar15 = pcVar15 + 1;
                    lVar13 = (long)cVar9 + lVar13 * 5;
                    cVar9 = *pcVar15;
                  } while (cVar9 != '\0');
                }
                uVar14 = (ulong)((long)(p_Var19->_M_v).first.first * 0xffff + lVar13) %
                         (ulong)this_00;
                *pp_Var20 = p_Var19->_M_next;
                p_Var19->_M_next = pp_Var8[uVar14];
                pp_Var8[uVar14] = p_Var19;
                pp_Var18 = (this->symbols_by_parent_).
                           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                           .
                           super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                           .
                           super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                           ._M_buckets;
                pp_Var20 = pp_Var18 + sVar16;
                p_Var19 = *pp_Var20;
              } while (p_Var19 != (_Node *)0x0);
            }
            sVar16 = sVar16 + 1;
          } while (sVar16 != sVar3);
        }
        operator_delete(pp_Var18,sVar3 * 8 + 8);
        (this->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_bucket_count = (size_type)this_00;
        (this->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_buckets = pp_Var8;
      }
      else {
        pp_Var8 = (this->symbols_by_parent_).
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                  .
                  super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                  .
                  super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ._M_buckets;
      }
      p_Var7->_M_next = pp_Var8[uVar12];
      pp_Var8[uVar12] = p_Var7;
      psVar1 = &(this->symbols_by_parent_).
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_element_count;
      *psVar1 = *psVar1 + 1;
      return true;
    }
    if ((p_Var7->_M_v).first.first == parent) {
      pcVar15 = (p_Var7->_M_v).first.second;
      iVar5 = strcmp((char *)name,pcVar15);
      if (iVar5 == 0) {
        return false;
      }
    }
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(
    const void* parent, const string& name, Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}